

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void compact_reopen_with_iterator(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar6;
  char *__format;
  long lVar7;
  fdb_kvs_handle *db;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_file_handle *compact_file;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_kvs_handle *local_4f8;
  fdb_iterator *local_4f0;
  fdb_doc *local_4e8;
  fdb_file_handle *local_4e0;
  fdb_file_handle *local_4d8;
  fdb_kvs_config local_4d0;
  timeval local_4b8;
  fdb_doc *apfStack_4a8 [9];
  fdb_kvs_info local_460;
  fdb_config local_430;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  gettimeofday(&local_4b8,(__timezone_ptr_t)0x0);
  memleak_start();
  local_4e8 = (fdb_doc *)0x0;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  fdb_open(&local_4e0,"./compact_test1",&local_430);
  fdb_kvs_open(local_4e0,&local_4f8,"db",&local_4d0);
  fVar4 = fdb_set_log_callback(local_4f8,logCallbackFunc,"compact_reopen_with_iterator");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x29b);
    compact_reopen_with_iterator()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x29b,"void compact_reopen_with_iterator()");
  }
  lVar7 = 0;
  for (uVar6 = 0; uVar6 != 9; uVar6 = uVar6 + 1) {
    sprintf(local_238,"key%d",uVar6 & 0xffffffff);
    sprintf(local_338,"meta%d",uVar6 & 0xffffffff);
    sprintf(local_138,"body%d",uVar6 & 0xffffffff);
    keylen = strlen(local_238);
    metalen = strlen(local_338);
    bodylen = strlen(local_138);
    fdb_doc_create((fdb_doc **)((long)apfStack_4a8 + lVar7),local_238,keylen,local_338,metalen,
                   local_138,bodylen);
    fdb_set(local_4f8,apfStack_4a8[uVar6]);
    lVar7 = lVar7 + 8;
  }
  fdb_commit(local_4e0,'\0');
  fdb_open(&local_4d8,"./compact_test1",&local_430);
  fVar4 = fdb_compact(local_4d8,"./compact_test2");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x2ad);
    compact_reopen_with_iterator()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x2ad,"void compact_reopen_with_iterator()");
  }
  fdb_close(local_4d8);
  fVar4 = fdb_iterator_init(local_4f8,&local_4f0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x2b3);
    compact_reopen_with_iterator()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x2b3,"void compact_reopen_with_iterator()");
  }
  lVar7 = 0;
  while( true ) {
    fVar4 = fdb_iterator_get(local_4f0,&local_4e8);
    doc = local_4e8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2b6);
      compact_reopen_with_iterator()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2b6,"void compact_reopen_with_iterator()");
    }
    pvVar1 = local_4e8->key;
    pfVar2 = apfStack_4a8[lVar7];
    pvVar3 = pfVar2->key;
    iVar5 = bcmp(pvVar1,pvVar3,local_4e8->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2b8);
      compact_reopen_with_iterator()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2b8,"void compact_reopen_with_iterator()");
    }
    pvVar1 = doc->meta;
    pvVar3 = pfVar2->meta;
    iVar5 = bcmp(pvVar1,pvVar3,doc->metalen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2b9);
      compact_reopen_with_iterator()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2b9,"void compact_reopen_with_iterator()");
    }
    pvVar1 = doc->body;
    pvVar3 = pfVar2->body;
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) break;
    fdb_doc_free(doc);
    local_4e8 = (fdb_doc *)0x0;
    lVar7 = lVar7 + 1;
    fVar4 = fdb_iterator_next(local_4f0);
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
      if ((int)lVar7 != 9) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x2c2);
        compact_reopen_with_iterator()::__test_pass = 1;
        __assert_fail("count==n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x2c2,"void compact_reopen_with_iterator()");
      }
      fVar4 = fdb_iterator_close(local_4f0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(local_4f8,&local_460);
        lVar7 = (long)(int)local_460.doc_count;
        fdb_kvs_close(local_4f8);
        fdb_close(local_4e0);
        fdb_open(&local_4e0,"./compact_test2",&local_430);
        fdb_kvs_open(local_4e0,&local_4f8,"db",&local_4d0);
        fdb_get_kvs_info(local_4f8,&local_460);
        if (lVar7 != CONCAT44(local_460.doc_count._4_4_,(int)local_460.doc_count)) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x2d6);
          compact_reopen_with_iterator()::__test_pass = '\x01';
          if (lVar7 != CONCAT44(local_460.doc_count._4_4_,(int)local_460.doc_count)) {
            __assert_fail("(uint64_t)nkvdocs == kvs_info.doc_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x2d6,"void compact_reopen_with_iterator()");
          }
        }
        fdb_kvs_close(local_4f8);
        fdb_close(local_4e0);
        for (lVar7 = 0; lVar7 != 9; lVar7 = lVar7 + 1) {
          fdb_doc_free(apfStack_4a8[lVar7]);
        }
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (compact_reopen_with_iterator()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"compact reopen with iterator");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x2c6);
      compact_reopen_with_iterator()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x2c6,"void compact_reopen_with_iterator()");
    }
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x2ba);
  compact_reopen_with_iterator()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x2ba,"void compact_reopen_with_iterator()");
}

Assistant:

void compact_reopen_with_iterator()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 9;
    int count = 0;
    int nkvdocs;
    fdb_file_handle *dbfile, *compact_file;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_kvs_info kvs_info;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_with_iterator");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // MB-13859: compact the file using a separate handle..
    fdb_open(&compact_file, "./compact_test1", &fconfig);
    // compact
    status = fdb_compact(compact_file, "./compact_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // close file after compaction to make the new_file's ref count 0
    fdb_close(compact_file);

    i = 0;
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
        count++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);

    TEST_CHK(count==n);


    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test2", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen with iterator");
}